

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
bas::Vector<bool,4ul,bas::RawAllocator>::Vector<4ul>
          (Vector<bool,4ul,bas::RawAllocator> *this,Vector<bool,_4UL,_bas::RawAllocator> *other)

{
  bool bVar1;
  size_t size_00;
  void *pvVar2;
  bool *pbVar3;
  size_t capacity;
  size_t size;
  Vector<bool,_4UL,_bas::RawAllocator> *other_local;
  Vector<bool,_4UL,_bas::RawAllocator> *this_local;
  
  size_00 = Vector<bool,_4UL,_bas::RawAllocator>::size(other);
  bVar1 = Vector<bool,_4UL,_bas::RawAllocator>::is_small(other);
  if (bVar1) {
    if (size_00 < 5) {
      pbVar3 = Vector<bool,_4UL,_bas::RawAllocator>::small_buffer
                         ((Vector<bool,_4UL,_bas::RawAllocator> *)this);
      *(bool **)this = pbVar3;
      *(size_t *)(this + 8) = *(long *)this + size_00;
      *(long *)(this + 0x10) = *(long *)this + 4;
      uninitialized_relocate_n<bool>(other->m_begin,size_00,*(bool **)this);
    }
    else {
      pvVar2 = RawAllocator::allocate((RawAllocator *)(this + 0x18),size_00,1);
      *(void **)this = pvVar2;
      *(size_t *)(this + 8) = *(long *)this + size_00;
      *(size_t *)(this + 0x10) = *(long *)this + size_00;
      uninitialized_relocate_n<bool>(other->m_begin,size_00,*(bool **)this);
    }
  }
  else {
    *(bool **)this = other->m_begin;
    *(bool **)(this + 8) = other->m_end;
    *(bool **)(this + 0x10) = other->m_capacity_end;
  }
  pbVar3 = Vector<bool,_4UL,_bas::RawAllocator>::small_buffer(other);
  other->m_begin = pbVar3;
  other->m_end = other->m_begin;
  other->m_capacity_end = other->m_begin + 4;
  *(long *)(this + 0x20) = *(long *)(this + 8) - *(long *)this;
  other->m_debug_size = (long)other->m_end - (long)other->m_begin;
  return;
}

Assistant:

Vector(Vector<T, OtherN, Allocator> &&other) noexcept
        : m_allocator(other.m_allocator)
    {
        size_t size = other.size();

        if (other.is_small()) {
            if (size <= N) {
                /* Copy between inline buffers. */
                m_begin = this->small_buffer();
                m_end = m_begin + size;
                m_capacity_end = m_begin + N;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
            else {
                /* Copy from inline buffer to newly allocated buffer. */
                size_t capacity = size;
                m_begin = (T *)m_allocator.allocate(
                    sizeof(T) * capacity, std::alignment_of<T>::value);
                m_end = m_begin + size;
                m_capacity_end = m_begin + capacity;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
        }
        else {
            /* Steal the pointer. */
            m_begin = other.m_begin;
            m_end = other.m_end;
            m_capacity_end = other.m_capacity_end;
        }

        other.m_begin = other.small_buffer();
        other.m_end = other.m_begin;
        other.m_capacity_end = other.m_begin + OtherN;
        UPDATE_VECTOR_SIZE(this);
        UPDATE_VECTOR_SIZE(&other);
    }